

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshConstruct(FmsMesh *mesh)

{
  void *pvVar1;
  undefined8 *in_RDI;
  FmsMesh m;
  undefined4 local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    pvVar1 = calloc(1,0x58);
    if (pvVar1 == (void *)0x0) {
      local_4 = 2;
    }
    else {
      *(undefined8 *)((long)pvVar1 + 0x20) = 1;
      *in_RDI = pvVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int FmsMeshConstruct(FmsMesh *mesh) {
  if (!mesh) { E_RETURN(1); }
  FmsMesh m;
  m = calloc(1, sizeof(*m));
  if (!m) { E_RETURN(2); }
  m->num_partitions = 1;
  *mesh = m;
  return 0;
}